

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void pnga_matmul_mirrored
               (char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
               Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
               Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
               Integer cjhi)

{
  undefined1 auVar1 [16];
  int iVar2;
  Integer IVar3;
  logical lVar4;
  logical lVar5;
  Integer IVar6;
  Integer *buf;
  Integer *hi;
  Integer *ld;
  long lVar7;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  Integer *pIVar11;
  Integer *pIVar12;
  char *pcVar13;
  double *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  char *in_RDI;
  Integer in_R8;
  long in_R9;
  double dVar14;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  Integer in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  Integer in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  long in_stack_00000060;
  long in_stack_00000068;
  Integer avail;
  Integer factor;
  Integer elems;
  Integer chi [2];
  Integer clo [2];
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  int local_sync_end;
  int local_sync_begin;
  Integer get_new_B;
  Integer iproc;
  Integer inode;
  Integer ZERO_I;
  int need_scaling;
  Integer max_chunk;
  Integer min_tasks;
  DoublePrecision chunk_cube;
  SingleComplex ONE_CF;
  DoubleComplex ONE;
  Integer Jchunk;
  Integer Kchunk;
  Integer Ichunk;
  Integer cdim;
  Integer bdim;
  Integer adim;
  Integer k;
  Integer m;
  Integer n;
  Integer kdim;
  Integer khi;
  Integer klo;
  Integer jdim;
  Integer jhi;
  Integer jlo;
  Integer idim;
  Integer ihi;
  Integer ilo;
  Integer j1;
  Integer j0;
  Integer i1;
  Integer i0;
  Integer ijk;
  Integer i;
  Integer nproc;
  Integer me;
  Integer rank;
  Integer dims [2];
  Integer cdim2;
  Integer cdim1;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  Integer ctype;
  Integer btype;
  Integer atype;
  DoubleComplex *c;
  DoubleComplex *b;
  DoubleComplex *a;
  void *in_stack_fffffffffffffcd8;
  Integer **in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  Integer **in_stack_fffffffffffffcf0;
  Integer *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  void *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd14;
  long local_2d0;
  Integer *local_2b0;
  Integer *local_2a8;
  Integer *local_2a0;
  Integer *local_298;
  Integer *local_228;
  Integer *local_220;
  Integer *local_218;
  Integer *local_210;
  Integer *local_208;
  int local_200;
  int local_1fc;
  long local_1f8;
  Integer local_1f0;
  Integer local_1e8;
  Integer local_1e0;
  int local_1d4;
  Integer *local_1d0;
  long local_1c8;
  double local_1c0;
  undefined4 local_1b8;
  undefined4 local_1b4;
  Integer local_1b0 [2];
  Integer *local_1a0;
  Integer *local_198;
  Integer *local_190;
  Integer in_stack_fffffffffffffe78;
  Integer *pIVar15;
  Integer *pIVar16;
  Integer *pIVar17;
  Integer *local_178;
  Integer *pIVar18;
  long local_148;
  long local_130;
  Integer *in_stack_fffffffffffffee8;
  long lVar19;
  Integer *in_stack_fffffffffffffef0;
  Integer *in_stack_fffffffffffffef8;
  Integer in_stack_ffffffffffffff00;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  
  local_88 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  local_b0 = 0;
  IVar3 = pnga_nodeid();
  iVar2 = _ga_sync_begin;
  local_f0 = 0;
  pIVar16 = (Integer *)0x0;
  local_1c8 = 10;
  local_1d4 = 1;
  local_1e0 = 0;
  local_1b0[0] = 0x3ff0000000000000;
  local_1b0[1] = 0;
  local_1b8 = 0x3f800000;
  local_1b4 = 0;
  local_1fc = _ga_sync_begin;
  local_200 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  lVar4 = pnga_is_mirrored(in_R8);
  lVar5 = pnga_is_mirrored(in_stack_00000020);
  if (lVar4 == lVar5) {
    lVar4 = pnga_is_mirrored(in_R8);
    lVar5 = pnga_is_mirrored(in_stack_00000048);
    if (lVar4 == lVar5) goto LAB_0015af77;
  }
  pnga_nnodes();
  pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
LAB_0015af77:
  lVar4 = pnga_is_mirrored(in_R8);
  if (lVar4 == 0) {
    local_e0 = pnga_nnodes();
    local_1f0 = IVar3;
  }
  else {
    local_1e8 = pnga_cluster_nodeid();
    local_e0 = pnga_cluster_nprocs(0x15afa6);
    IVar6 = pnga_cluster_procid((Integer)in_stack_fffffffffffffce0,
                                (Integer)in_stack_fffffffffffffcd8);
    local_1f0 = IVar3 - IVar6;
  }
  pnga_inquire(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  if (local_d0 < 3) {
    if (local_d0 == 2) {
      local_88 = local_c8;
      local_90 = local_c0;
    }
    else if (local_d0 == 1) {
      if (in_stack_00000008 - in_R9 < 1) {
        local_88 = 1;
        local_90 = local_c8;
      }
      else {
        local_88 = local_c8;
        local_90 = 1;
      }
    }
    else {
      pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
    }
  }
  else {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  pnga_inquire(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  if (local_d0 < 3) {
    if (local_d0 == 2) {
      local_98 = local_c8;
      local_a0 = local_c0;
    }
    else if (local_d0 == 1) {
      if (in_stack_00000030 - in_stack_00000028 < 1) {
        local_98 = 1;
        local_a0 = local_c8;
      }
      else {
        local_98 = local_c8;
        local_a0 = 1;
      }
    }
    else {
      pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
    }
  }
  else {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  pnga_inquire(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  if (local_d0 < 3) {
    if (local_d0 == 2) {
      local_a8 = local_c8;
      local_b0 = local_c0;
    }
    else if (local_d0 == 1) {
      if (in_stack_00000058 - in_stack_00000050 < 1) {
        local_a8 = 1;
        local_b0 = local_c8;
      }
      else {
        local_a8 = local_c8;
        local_b0 = 1;
      }
    }
    else {
      pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
    }
  }
  else {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if ((local_70 != local_78) || (local_70 != local_80)) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if ((((local_70 != 0x3ef) && (local_70 != 0x3ec)) && (local_70 != 0x3eb)) && (local_70 != 0x3ee))
  {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
    if (((in_R9 < 1) || ((local_88 < in_stack_00000008 || (in_stack_00000010 < 1)))) ||
       (local_90 < in_stack_00000018)) {
      pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
    }
  }
  else if ((((in_R9 < 1) || (local_90 < in_stack_00000008)) || (in_stack_00000010 < 1)) ||
          (local_88 < in_stack_00000018)) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
    if (((in_stack_00000028 < 1) || ((local_98 < in_stack_00000030 || (in_stack_00000038 < 1)))) ||
       (local_a0 < in_stack_00000040)) {
      pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
    }
  }
  else if ((((in_stack_00000028 < 1) || (local_a0 < in_stack_00000030)) || (in_stack_00000038 < 1))
          || (local_98 < in_stack_00000040)) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if (((in_stack_00000050 < 1) || (local_a8 < in_stack_00000058)) ||
     ((in_stack_00000060 < 1 || (local_b0 < in_stack_00000068)))) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  buf = (Integer *)((in_stack_00000008 - in_R9) + 1);
  hi = (Integer *)((in_stack_00000040 - in_stack_00000038) + 1);
  ld = (Integer *)((in_stack_00000018 - in_stack_00000010) + 1);
  if ((Integer *)((in_stack_00000058 - in_stack_00000050) + 1) != buf) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if ((Integer *)((in_stack_00000068 - in_stack_00000060) + 1) != hi) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  if ((Integer *)((in_stack_00000030 - in_stack_00000028) + 1) != ld) {
    pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
  }
  local_1c0 = ((double)(long)ld * (double)((long)buf * (long)hi)) / (double)(local_1c8 * local_e0);
  dVar14 = pow(local_1c0,0.3333333333333333);
  local_1d0 = (Integer *)(long)dVar14;
  if ((long)local_1d0 < 0x20) {
    local_1d0 = (Integer *)0x20;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = ga_types[local_70 + -1000].size;
  lVar7 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar1,0);
  local_198 = (Integer *)0x100;
  local_1a0 = (Integer *)0x100;
  local_190 = (Integer *)0x100;
  if (0x100 < (long)local_1d0) {
    IVar3 = pnga_memory_avail_type((Integer)in_stack_fffffffffffffcd8);
    lVar4 = pnga_is_mirrored(in_R8);
    if (lVar4 == 0) {
      fflush(_stdout);
      pnga_type_f2c(0x3f2);
      pnga_gop((Integer)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (Integer)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    }
    else {
      fflush(_stdout);
      armci_msg_gop_scope(in_stack_fffffffffffffd14,in_stack_fffffffffffffd08,
                          (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                          (char *)in_stack_fffffffffffffcf8,
                          (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      fflush(_stdout);
    }
    if ((IVar3 < 0x40) && (IVar6 = pnga_nodeid(), IVar6 == 0)) {
      pnga_error((char *)pIVar16,in_stack_fffffffffffffe78);
    }
    pIVar11 = local_1d0;
    dVar14 = sqrt((double)(((long)((double)IVar3 * 0.9) + -4) / 3));
    if ((long)dVar14 < (long)pIVar11) {
      dVar14 = sqrt((double)(((long)((double)IVar3 * 0.9) + -4) / 3));
      local_298 = (Integer *)(long)dVar14;
    }
    else {
      local_298 = local_1d0;
    }
    local_1d0 = local_298;
    local_2a0 = buf;
    if ((long)local_298 < (long)buf) {
      local_2a0 = local_298;
    }
    local_190 = local_2a0;
    local_2a8 = hi;
    if ((long)local_298 < (long)hi) {
      local_2a8 = local_298;
    }
    local_1a0 = local_2a8;
    local_2b0 = ld;
    if ((long)local_298 < (long)ld) {
      local_2b0 = local_298;
    }
    local_198 = local_2b0;
  }
  pvVar8 = pnga_malloc((Integer)in_stack_fffffffffffffcf0,
                       (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                       (char *)in_stack_fffffffffffffce0);
  pcVar9 = (char *)((long)pvVar8 + (((long)local_190 * (long)local_198) / lVar7) * 0x10 + 0x10);
  lVar7 = ((long)local_198 * (long)local_1a0) / lVar7;
  pcVar10 = pcVar9 + lVar7 * 0x10 + 0x10;
  if (local_70 == 0x3ef) {
    if (((*in_RCX == 0.0) && (!NAN(*in_RCX))) && ((in_RCX[1] == 0.0 && (!NAN(in_RCX[1]))))) {
      local_1d4 = 0;
    }
  }
  else if (local_70 == 0x3ee) {
    if ((((*(float *)in_RCX == 0.0) && (!NAN(*(float *)in_RCX))) &&
        (*(float *)((long)in_RCX + 4) == 0.0)) && (!NAN(*(float *)((long)in_RCX + 4)))) {
      local_1d4 = 0;
    }
  }
  else if (local_70 == 0x3ec) {
    if ((*in_RCX == 0.0) && (!NAN(*in_RCX))) {
      local_1d4 = 0;
    }
  }
  else if ((*(float *)in_RCX == 0.0) && (!NAN(*(float *)in_RCX))) {
    local_1d4 = 0;
  }
  pnga_mask_sync(local_1e0,local_1e0);
  if (local_1d4 == 0) {
    pnga_fill_patch((Integer)ONE.imag,(Integer *)ONE.real,(Integer *)ONE_CF,(void *)chunk_cube);
  }
  else {
    pnga_scale_patch((Integer)ONE.imag,(Integer *)ONE.real,(Integer *)ONE_CF,(void *)chunk_cube);
  }
  for (local_130 = 0; local_130 < (long)hi; local_130 = (long)local_1a0 + local_130) {
    pIVar11 = hi;
    if ((long)local_1a0 + local_130 + -1 < (long)hi + -1) {
      pIVar11 = (Integer *)(local_130 + (long)local_1a0);
    }
    pIVar11 = (Integer *)((long)pIVar11 - local_130);
    for (local_148 = 0; local_148 < (long)ld; local_148 = (long)local_198 + local_148) {
      pIVar12 = ld;
      if ((long)local_198 + local_148 + -1 < (long)ld + -1) {
        pIVar12 = (Integer *)(local_148 + (long)local_198);
      }
      local_2d0 = (long)pIVar12 + -1;
      local_178 = (Integer *)((local_2d0 - local_148) + 1);
      local_1f8 = 1;
      for (lVar19 = 0; lVar19 < (long)buf; lVar19 = (long)local_190 + lVar19) {
        if (local_f0 % local_e0 == local_1f0) {
          pIVar12 = buf;
          if ((long)local_190 + lVar19 + -1 < (long)buf + -1) {
            pIVar12 = (Integer *)(lVar19 + (long)local_190);
          }
          pIVar12 = (Integer *)((long)pIVar12 - lVar19);
          if (local_70 == 0x3eb) {
            for (local_e8 = 0; local_e8 < (long)pIVar12 * (long)pIVar11; local_e8 = local_e8 + 1) {
              pcVar13 = pcVar10 + local_e8 * 4;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
            }
          }
          else if (local_70 == 0x3ec) {
            for (local_e8 = 0; local_e8 < (long)pIVar12 * (long)pIVar11; local_e8 = local_e8 + 1) {
              pcVar13 = pcVar10 + local_e8 * 8;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
              pcVar13[4] = '\0';
              pcVar13[5] = '\0';
              pcVar13[6] = '\0';
              pcVar13[7] = '\0';
            }
          }
          else if (local_70 == 0x3ee) {
            for (local_e8 = 0; local_e8 < (long)pIVar12 * (long)pIVar11; local_e8 = local_e8 + 1) {
              pcVar13 = pcVar10 + local_e8 * 8;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
              pcVar13 = pcVar9 + local_e8 * 8 + lVar7 * 0x10 + 0x14;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
            }
          }
          else {
            for (local_e8 = 0; local_e8 < (long)pIVar12 * (long)pIVar11; local_e8 = local_e8 + 1) {
              pcVar13 = pcVar10 + local_e8 * 0x10;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
              pcVar13[4] = '\0';
              pcVar13[5] = '\0';
              pcVar13[6] = '\0';
              pcVar13[7] = '\0';
              pcVar13 = pcVar10 + local_e8 * 0x10 + 8;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
              pcVar13[4] = '\0';
              pcVar13[5] = '\0';
              pcVar13[6] = '\0';
              pcVar13[7] = '\0';
            }
          }
          pIVar15 = pIVar12;
          pIVar17 = local_178;
          if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
            pnga_get(local_2d0,local_178,hi,buf,ld);
            local_178 = pIVar12;
          }
          else {
            pnga_get(local_2d0,local_178,hi,buf,ld);
          }
          if (local_1f8 != 0) {
            if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
              pIVar18 = pIVar17;
              pnga_get(local_2d0,pIVar17,hi,buf,ld);
              pIVar16 = pIVar17;
              pIVar17 = pIVar18;
            }
            else {
              pIVar16 = pIVar11;
              pnga_get(local_2d0,pIVar17,hi,buf,ld);
            }
            local_1f8 = 0;
          }
          local_218 = pIVar17;
          local_228 = pIVar16;
          local_220 = local_178;
          local_210 = pIVar11;
          local_208 = pIVar12;
          pIVar16 = local_228;
          local_178 = local_218;
          switch(local_70) {
          case 0x3eb:
            in_stack_fffffffffffffce0 = &local_220;
            in_stack_fffffffffffffcf0 = &local_228;
            in_stack_fffffffffffffcf8 = (Integer *)&local_1b8;
            in_stack_fffffffffffffcd8 = pvVar8;
            in_stack_fffffffffffffce8 = pcVar9;
            in_stack_fffffffffffffd00 = pcVar10;
            gal_sgemm_(in_RDI,in_RSI,&local_208,&local_210,&local_218,in_RDX);
            break;
          case 0x3ec:
            in_stack_fffffffffffffce0 = &local_220;
            in_stack_fffffffffffffcf0 = &local_228;
            in_stack_fffffffffffffcf8 = local_1b0;
            in_stack_fffffffffffffcd8 = pvVar8;
            in_stack_fffffffffffffce8 = pcVar9;
            in_stack_fffffffffffffd00 = pcVar10;
            gal_dgemm_(in_RDI,in_RSI,&local_208,&local_210,&local_218,in_RDX);
            break;
          default:
            pnga_error((char *)local_228,(Integer)pIVar15);
            break;
          case 0x3ee:
            in_stack_fffffffffffffce0 = &local_220;
            in_stack_fffffffffffffcf0 = &local_228;
            in_stack_fffffffffffffcf8 = (Integer *)&local_1b8;
            in_stack_fffffffffffffcd8 = pvVar8;
            in_stack_fffffffffffffce8 = pcVar9;
            in_stack_fffffffffffffd00 = pcVar10;
            gal_cgemm_(in_RDI,in_RSI,&local_208,&local_210,&local_218,in_RDX);
            break;
          case 0x3ef:
            in_stack_fffffffffffffce0 = &local_220;
            in_stack_fffffffffffffcf0 = &local_228;
            in_stack_fffffffffffffcf8 = local_1b0;
            in_stack_fffffffffffffcd8 = pvVar8;
            in_stack_fffffffffffffce8 = pcVar9;
            in_stack_fffffffffffffd00 = pcVar10;
            gal_zgemm_(in_RDI,in_RSI,&local_208,&local_210,&local_218,in_RDX);
          }
          if ((local_70 == 0x3eb) || (local_70 == 0x3ee)) {
            pnga_acc((Integer)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     (Integer *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (Integer *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          }
          else {
            pnga_acc((Integer)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     (Integer *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (Integer *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          }
        }
        local_f0 = local_f0 + 1;
      }
    }
  }
  pnga_free((void *)0x15c87d);
  if (local_200 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_matmul_mirrored(transa, transb, alpha, beta,
			g_a, ailo, aihi, ajlo, ajhi,
			g_b, bilo, bihi, bjlo, bjhi,
			g_c, cilo, cihi, cjlo, cjhi)

     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{

    #ifdef STATBUF
  /* approx. sqrt(2) ratio in chunk size to use the same buffer space */
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2], rank;
Integer me= pnga_nodeid(), nproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, adim, bdim=0, cdim;
Integer Ichunk, Kchunk, Jchunk;
DoubleComplex ONE;
SingleComplex ONE_CF;

DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int need_scaling=1;
Integer ZERO_I = 0, inode, iproc;
Integer get_new_B;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
Integer clo[2], chi[2];

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;

   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();


   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &rank, dims); 
   VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
   pnga_inquire(g_b, &btype, &rank, dims); 
   VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
   pnga_inquire(g_c, &ctype, &rank, dims); 
   VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   
   
   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
     if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error("  g_a indices out of range ", g_a);
   }else
     if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
       pnga_error("  g_a indices out of range ", g_a);
   
   if (*transb == 'n' || *transb == 'N'){
     if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error("  g_b indices out of range ", g_b);
   }else
     if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
       pnga_error("  g_b indices out of range ", g_b);
   
   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
     pnga_error("  g_c indices out of range ", g_c);
   
   /* verify if patch dimensions are consistent */
   m = aihi - ailo +1;
   n = bjhi - bjlo +1;
   k = ajhi - ajlo +1;
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   

   /* In 32-bit platforms, k*m*n might exceed the "long" range(2^31), 
      eg:k=m=n=1600. So casting the temporary value to "double" helps */
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;

#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     /**
      * Find out how much memory we can grab.  It will be used in
      * three chunks, and the result includes only the first one.
      */
     
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       if (pnga_is_mirrored(g_a)) {
         fflush(stdout);
         if (sizeof(Integer)/sizeof(int) > 1)
           armci_msg_gop_scope(SCOPE_NODE, &avail, 1, "min", ARMCI_LONG);
         else
           armci_msg_gop_scope(SCOPE_NODE, &avail, 1, "min", ARMCI_INT);
         fflush(stdout);
       } else {
         fflush(stdout);
         pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       }
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("NotEnough memory",avail);
       elems = (Integer)(avail*0.9); /* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;
     
     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0) need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   pnga_mask_sync(ZERO_I, ZERO_I);
   clo[0] = cilo; clo[1] = cjlo;
   chi[0] = cihi; chi[1] = cjhi;
   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else  pnga_fill_patch(g_c, clo, chi, beta);

   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;

       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);          /* loop rows of g_b patch */
	 kdim= khi - klo +1;                                     
	 
	 /** Each pass through the outer two loops means we need a
	     different patch of B.*/
	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){

	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype ==  C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
	     else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_get(g_a, clo, chi, a, &idim);
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_get(g_a, clo, chi, a, &kdim);
	     }


	     /* Avoid rereading B if it is the same patch as last time. */
        if(get_new_B) { 
          if (*transb == 'n' || *transb == 'N'){ 
            bdim = kdim;
            i0= bilo+klo; i1= bilo+khi;   
            j0= bjlo+jlo; j1= bjlo+jhi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_get(g_b, clo, chi, b, &kdim);
          }else{
            bdim = jdim;
            i0= bjlo+jlo; i1= bjlo+jhi;   
            j0= bilo+klo; j1= bilo+khi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_get(g_b, clo, chi, b, &jdim);
          }
          get_new_B = FALSE; /* Until J or K change again */
        }

	     
	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

	     switch(atype) {
	     case C_FLOAT:
	       BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (Real *)alpha, (Real *)a, &adim_t,
              (Real *)b, &bdim_t, (Real *)&ONE_CF,
              (Real *)c, &cdim_t);
	       break;
	     case C_DBL:
	       BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
              (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
              (DoublePrecision *)c, &cdim_t);
	       break;
	     case C_DCPL:
	       BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
              (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
              (DoubleComplex *)c, &cdim_t);
	       break;
	     case C_SCPL:
	       BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
              (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
              (SingleComplex *)c, &cdim_t);
	       break;
	     default:
	       pnga_error("ga_matmul_patch: wrong data type", atype);
	     }
	     
	     i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
	     if(atype == C_FLOAT || atype == C_SCPL)  {
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_acc(g_c, clo, chi, (float *)c, &cdim, &ONE_CF);
        } else {
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_acc(g_c, clo, chi, (DoublePrecision*)c, &cdim, (DoublePrecision*)&ONE);
        }
	   }
	   ++ijk;
	 }
       }
   }
   
#ifndef STATBUF
   pnga_free(a);
#endif

   if(local_sync_end)pnga_sync();

}